

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsync_semaphore_futex.c
# Opt level: O3

void nsync::nsync_mu_semaphore_v(nsync_semaphore *s)

{
  int iVar1;
  long lVar2;
  futex *f;
  bool bVar3;
  
  do {
    iVar1 = *(int *)s->sem_space;
    LOCK();
    bVar3 = iVar1 == *(int *)s->sem_space;
    if (bVar3) {
      *(int *)s->sem_space = iVar1 + 1;
    }
    UNLOCK();
  } while (!bVar3);
  lVar2 = syscall(0xca,s,0x81,1,0,0,0);
  if ((int)lVar2 < 0) {
    _DAT_00000000 = 0;
  }
  return;
}

Assistant:

void nsync_mu_semaphore_v (nsync_semaphore *s) {
	struct futex *f = (struct futex *) s;
        uint32_t old_value;
        do {    
                old_value = ATM_LOAD ((nsync_atomic_uint32_ *) &f->i);
        } while (!ATM_CAS_REL ((nsync_atomic_uint32_ *) &f->i, old_value, old_value+1));
	ASSERT (futex (&f->i, FUTEX_WAKE_, 1, NULL, NULL, 0) >= 0);
}